

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

ULONG PAL_strtoul(char *szNumber,char **pszEnd,int nBase)

{
  int iVar1;
  int *piVar2;
  char local_29;
  ulong uStack_28;
  char ch;
  unsigned_long ulResult;
  int nBase_local;
  char **pszEnd_local;
  char *szNumber_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  uStack_28 = strtoul(szNumber,pszEnd,nBase);
  if (0xffffffff < uStack_28) {
    local_29 = *szNumber;
    pszEnd_local = (char **)szNumber;
    while (iVar1 = isspace((int)local_29), iVar1 != 0) {
      local_29 = *(char *)pszEnd_local;
      pszEnd_local = (char **)((long)pszEnd_local + 1);
    }
    if (local_29 != '-') {
      uStack_28 = 0xffffffff;
      piVar2 = __errno_location();
      *piVar2 = 0x22;
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return (ULONG)uStack_28;
  }
  abort();
}

Assistant:

ULONG
__cdecl
PAL_strtoul(const char *szNumber, char **pszEnd, int nBase)
{
    unsigned long ulResult;

    PERF_ENTRY(strtoul);
    ENTRY("strtoul (szNumber=%p (%s), pszEnd=%p, nBase=%d)\n",
        szNumber?szNumber:"NULL",
        szNumber?szNumber:"NULL",
        pszEnd,
        nBase);

    ulResult = strtoul(szNumber, pszEnd, nBase);

#ifdef BIT64
    if (ulResult > _UI32_MAX)
    {
        char ch = *szNumber;
        while (isspace(ch))
        {
	    ch = *szNumber++;
        }
        /* If the string represents a positive number that is greater than
            _UI32_MAX, set errno to ERANGE. Otherwise, don't set errno
            to match Windows behavior. */
        if (ch != '-')
        {
            ulResult = _UI32_MAX;
            errno = ERANGE;
        }
    }
#endif

    LOGEXIT("strtoul returning unsigned long %lu\n", ulResult);
    PERF_EXIT(wcstoul);

    /* When returning unsigned long res from this function, it will be
        implicitly cast to ULONG. This handles situations where a string that
        represents a negative number is passed in to strtoul. The Windows
        behavior is analogous to taking the binary equivalent of the negative
        value and treating it as a positive number. Returning a ULONG from
        this function, as opposed to native unsigned long, allows us to match
        this behavior. The explicit cast to ULONG below is used to silence any
        potential warnings due to the implicit casting.  */
    return (ULONG)ulResult;

}